

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O3

int __thiscall
ON_PolylineCurve::IsPolyline
          (ON_PolylineCurve *this,ON_SimpleArray<ON_3dPoint> *pline_points,
          ON_SimpleArray<double> *pline_t)

{
  int iVar1;
  int iVar2;
  
  if ((pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) && (-1 < pline_points->m_capacity)) {
    pline_points->m_count = 0;
  }
  if ((pline_t != (ON_SimpleArray<double> *)0x0) && (-1 < pline_t->m_capacity)) {
    pline_t->m_count = 0;
  }
  iVar1 = ON_Polyline::PointCount(&this->m_pline);
  iVar2 = 0;
  if (1 < iVar1) {
    if (pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) {
      ON_SimpleArray<ON_3dPoint>::operator=
                (pline_points,(ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
    }
    iVar2 = iVar1;
    if (pline_t != (ON_SimpleArray<double> *)0x0) {
      ON_SimpleArray<double>::operator=(pline_t,&this->m_t);
    }
  }
  return iVar2;
}

Assistant:

int ON_PolylineCurve::IsPolyline(
      ON_SimpleArray<ON_3dPoint>* pline_points,
      ON_SimpleArray<double>* pline_t
      ) const
{
  if ( pline_points )
    pline_points->SetCount(0);
  if ( pline_t )
    pline_t->SetCount(0);
  int rc = this->PointCount();
  if ( rc >= 2 )
  {
    if ( pline_points )
      pline_points->operator=(m_pline);
    if ( pline_t )
      pline_t->operator=(m_t);
  }
  else
    rc = 0;
  return rc;
}